

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_reporting.cc
# Opt level: O2

void google::AddString(string *s,string *final_string,int *chars_in_line)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (int)s->_M_string_length;
  if (*chars_in_line + iVar1 + 1 < 0x50) {
    std::__cxx11::string::append((char *)final_string);
    iVar2 = *chars_in_line + 1;
  }
  else {
    std::__cxx11::string::append((char *)final_string);
    iVar2 = 6;
  }
  *chars_in_line = iVar2;
  std::__cxx11::string::append((string *)final_string);
  *chars_in_line = *chars_in_line + iVar1;
  return;
}

Assistant:

static void AddString(const string& s,
                      string* final_string, int* chars_in_line) {
  const int slen = static_cast<int>(s.length());
  if (*chars_in_line + 1 + slen >= kLineLength) {  // < 80 chars/line
    *final_string += "\n      ";
    *chars_in_line = 6;
  } else {
    *final_string += " ";
    *chars_in_line += 1;
  }
  *final_string += s;
  *chars_in_line += slen;
}